

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O3

void FLog::mfree(time_t dateTime,int line,string *function,string *file)

{
  pointer pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  pthread_t pVar5;
  char *pcVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  undefined8 uVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  string *psVar14;
  size_type *psVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  string __str;
  string temp;
  string __str_1;
  string timeTemp;
  string threadIdStr;
  mutex locker;
  ostringstream sstream;
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  ulong *local_4f0;
  long local_4e8;
  ulong local_4e0 [2];
  long *local_4d0;
  undefined8 local_4c8;
  long local_4c0;
  undefined8 uStack_4b8;
  long *local_4b0;
  long local_4a8;
  long local_4a0;
  long lStack_498;
  time_t local_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  string local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  string *local_388;
  long local_380;
  string local_378;
  long local_358;
  long lStack_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  long *local_2a8;
  long local_298 [2];
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_490 = dateTime;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pVar5 = pthread_self();
  if (pVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"thread::id of a non-executing thread",0x24);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  std::__cxx11::stringbuf::str();
  if (1 < (int)logLevel) goto LAB_0010c0fd;
  cVar2 = (char)(line >> 0x1f);
  if (printAll != false || printWarning != false) {
    pcVar6 = ctime(&local_490);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,pcVar6,(allocator<char> *)local_248);
    std::__cxx11::string::replace
              ((ulong)&local_328,local_328._M_string_length - 1,(char *)0x1,0x10e15d);
    std::operator+(&local_268," [DateTime: ",&local_328);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_488 = &local_478;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_478 = *plVar12;
      lStack_470 = plVar7[3];
    }
    else {
      local_478 = *plVar12;
      local_488 = (long *)*plVar7;
    }
    local_480 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
    local_468 = &local_458;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_458 = *plVar12;
      lStack_450 = plVar7[3];
    }
    else {
      local_458 = *plVar12;
      local_468 = (long *)*plVar7;
    }
    local_460 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_468);
    local_510 = &local_500;
    puVar13 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar13) {
      local_500 = *puVar13;
      lStack_4f8 = plVar7[3];
    }
    else {
      local_500 = *puVar13;
      local_510 = (ulong *)*plVar7;
    }
    local_508 = plVar7[1];
    *plVar7 = (long)puVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uVar17 = -line;
    if (0 < line) {
      uVar17 = line;
    }
    uVar18 = 1;
    if (9 < uVar17) {
      uVar16 = (ulong)uVar17;
      uVar3 = 4;
      do {
        uVar18 = uVar3;
        uVar11 = (uint)uVar16;
        if (uVar11 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0010b6fc;
        }
        if (uVar11 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0010b6fc;
        }
        if (uVar11 < 10000) goto LAB_0010b6fc;
        uVar16 = uVar16 / 10000;
        uVar3 = uVar18 + 4;
      } while (99999 < uVar11);
      uVar18 = uVar18 + 1;
    }
LAB_0010b6fc:
    local_4f0 = local_4e0;
    std::__cxx11::string::_M_construct((ulong)&local_4f0,(char)uVar18 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)line >> 0x1f) + (long)local_4f0),uVar18,uVar17);
    uVar16 = 0xf;
    if (local_510 != &local_500) {
      uVar16 = local_500;
    }
    if (uVar16 < (ulong)(local_4e8 + local_508)) {
      uVar16 = 0xf;
      if (local_4f0 != local_4e0) {
        uVar16 = local_4e0[0];
      }
      if (uVar16 < (ulong)(local_4e8 + local_508)) goto LAB_0010b77b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_4f0,0,(char *)0x0,(ulong)local_510);
    }
    else {
LAB_0010b77b:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_4f0);
    }
    local_4d0 = &local_4c0;
    plVar7 = puVar8 + 2;
    if ((long *)*puVar8 == plVar7) {
      local_4c0 = *plVar7;
      uStack_4b8 = puVar8[3];
    }
    else {
      local_4c0 = *plVar7;
      local_4d0 = (long *)*puVar8;
    }
    local_4c8 = puVar8[1];
    *puVar8 = plVar7;
    puVar8[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    local_448 = &local_438;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_438 = *plVar12;
      lStack_430 = plVar7[3];
    }
    else {
      local_438 = *plVar12;
      local_448 = (long *)*plVar7;
    }
    local_440 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_448);
    local_428 = &local_418;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_418 = *plVar12;
      lStack_410 = plVar7[3];
    }
    else {
      local_418 = *plVar12;
      local_428 = (long *)*plVar7;
    }
    local_420 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_428,(ulong)(function->_M_dataplus)._M_p);
    local_408 = &local_3f8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_3f8 = *plVar12;
      lStack_3f0 = plVar7[3];
    }
    else {
      local_3f8 = *plVar12;
      local_408 = (long *)*plVar7;
    }
    local_400 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_408);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_398 = *plVar12;
      lStack_390 = plVar7[3];
      local_3a8 = &local_398;
    }
    else {
      local_398 = *plVar12;
      local_3a8 = (long *)*plVar7;
    }
    local_3a0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
    psVar14 = (string *)(plVar7 + 2);
    if ((string *)*plVar7 == psVar14) {
      local_378._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_378._M_string_length = plVar7[3];
      local_388 = &local_378;
    }
    else {
      local_378._M_dataplus._M_p = (psVar14->_M_dataplus)._M_p;
      local_388 = (string *)*plVar7;
    }
    local_380 = plVar7[1];
    *plVar7 = (long)psVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2a8);
    local_3e8 = &local_3d8;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_3d8 = *plVar12;
      lStack_3d0 = plVar7[3];
    }
    else {
      local_3d8 = *plVar12;
      local_3e8 = (long *)*plVar7;
    }
    local_3e0 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_358 = *plVar12;
      lStack_350 = plVar7[3];
      local_378.field_2._M_allocated_capacity = (size_type)&local_358;
    }
    else {
      local_358 = *plVar12;
      local_378.field_2._M_allocated_capacity = (size_type)(long *)*plVar7;
    }
    local_378.field_2._8_8_ = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_378.field_2._M_local_buf);
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_338 = *plVar12;
      lStack_330 = plVar7[3];
      local_348 = &local_338;
    }
    else {
      local_338 = *plVar12;
      local_348 = (long *)*plVar7;
    }
    local_340 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_348,(ulong)(file->_M_dataplus)._M_p);
    psVar15 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar15) {
      local_248._16_8_ = *psVar15;
      local_248._24_8_ = plVar7[3];
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._16_8_ = *psVar15;
      local_248._0_8_ = (size_type *)*plVar7;
    }
    local_248._8_8_ = plVar7[1];
    *plVar7 = (long)psVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_248);
    local_4b0 = &local_4a0;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_4a0 = *plVar12;
      lStack_498 = plVar7[3];
    }
    else {
      local_4a0 = *plVar12;
      local_4b0 = (long *)*plVar7;
    }
    local_4a8 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((long *)local_378.field_2._M_allocated_capacity != &local_358) {
      operator_delete((void *)local_378.field_2._M_allocated_capacity,local_358 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,(ulong)(local_378._M_dataplus._M_p + 1));
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,local_398 + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418 + 1);
    }
    if (local_448 != &local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,local_4c0 + 1);
    }
    if (local_4f0 != local_4e0) {
      operator_delete(local_4f0,local_4e0[0] + 1);
    }
    if (local_510 != &local_500) {
      operator_delete(local_510,local_500 + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if (local_488 != &local_478) {
      operator_delete(local_488,local_478 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    local_248._16_8_ = 0;
    local_248._24_8_ = (__pthread_internal_list *)0x0;
    local_248._0_8_ = (ulong *)0x0;
    local_248._8_8_ = 0;
    local_248._32_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_248);
    if (iVar4 != 0) {
      uVar10 = std::__throw_system_error(iVar4);
      if ((ulong *)local_248._0_8_ != &local_500) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if (local_348 != &local_458) {
        operator_delete(local_348,local_338 + 1);
      }
      if ((long *)local_378.field_2._M_allocated_capacity != &local_358) {
        operator_delete((void *)local_378.field_2._M_allocated_capacity,local_358 + 1);
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_388 != file) {
        operator_delete(local_388,(ulong)(local_378._M_dataplus._M_p + 1));
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if (local_408 != &local_3f8) {
        operator_delete(local_408,local_3f8 + 1);
      }
      if (local_428 != &local_418) {
        operator_delete(local_428,local_418 + 1);
      }
      if (local_448 != &local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,local_4c0 + 1);
      }
      if (local_4f0 != local_4e0) {
        operator_delete(local_4f0,local_4e0[0] + 1);
      }
      if (local_510 != &local_500) {
        operator_delete(local_510,local_500 + 1);
      }
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458 + 1);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488,local_478 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,local_298[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      _Unwind_Resume(uVar10);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::clog,(char *)local_4b0,local_4a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)local_248);
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0,local_4a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar6 = ctime(&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,pcVar6,(allocator<char> *)&local_328);
  uVar17 = -line;
  if (0 < line) {
    uVar17 = line;
  }
  uVar18 = 1;
  if (9 < uVar17) {
    uVar16 = (ulong)uVar17;
    uVar3 = 4;
    do {
      uVar18 = uVar3;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_0010becd;
      }
      if (uVar11 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_0010becd;
      }
      if (uVar11 < 10000) goto LAB_0010becd;
      uVar16 = uVar16 / 10000;
      uVar3 = uVar18 + 4;
    } while (99999 < uVar11);
    uVar18 = uVar18 + 1;
  }
LAB_0010becd:
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_3c8,(char)uVar18 - cVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_3c8._M_dataplus._M_p + ((uint)line >> 0x1f),uVar18,uVar17);
  pcVar1 = (file->_M_dataplus)._M_p;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,pcVar1 + file->_M_string_length);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Free ","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"warning","");
  FONQRI::Log::Log((Log *)local_248,&local_288,&local_3c8,&local_2c8,&local_2e8,&local_308);
  std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::emplace_back<FONQRI::Log>
            (&normalLogList,(Log *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._32_8_ != &local_218) {
    operator_delete((void *)local_248._32_8_,local_218._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
LAB_0010c0fd:
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FLog::mfree(const time_t dateTime, int line, std::string function,
		 std::string file)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel < FLog::important) {
		if (FLog::printWarning | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " + " [Type: Free ] " +
			" [Line: " + std::to_string(line) + " ] " +
			" [Function: " + function + " ] " + " [Thread Id: " +
			threadIdStr + " ] " + " [File: " + file + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, "Free ", "warning"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}